

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStream.cpp
# Opt level: O2

void __thiscall DIS::DataStream::DoRead(DataStream *this,char *ch,size_t bufsize)

{
  uint uVar1;
  reference pvVar2;
  ulong uVar3;
  
  for (uVar1 = 0; uVar3 = (ulong)uVar1, uVar3 < bufsize; uVar1 = uVar1 + 1) {
    pvVar2 = std::vector<char,_std::allocator<char>_>::at(&this->_buffer,this->_read_pos + uVar3);
    ch[uVar3] = *pvVar2;
  }
  return;
}

Assistant:

void DataStream::DoRead(char* ch, size_t bufsize)
{
   for(unsigned int i=0; i<bufsize; i++)
   {
      ch[i] = _buffer.at(_read_pos+i);
   }
}